

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__cloexec(int fd,int set)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  int flags;
  int set_local;
  int fd_local;
  
  do {
    iVar1 = fcntl(fd,2,(ulong)(set != 0));
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == 0) {
    set_local = 0;
  }
  else {
    piVar2 = __errno_location();
    set_local = -*piVar2;
  }
  return set_local;
}

Assistant:

int uv__cloexec(int fd, int set) {
  int flags;
  int r;

  flags = 0;
  if (set)
    flags = FD_CLOEXEC;

  do
    r = fcntl(fd, F_SETFD, flags);
  while (r == -1 && errno == EINTR);

  if (r)
    return UV__ERR(errno);

  return 0;
}